

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

LispPTR UFS_renamefile(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar7;
  DLword *pDVar8;
  int unaff_EBP;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  char fbuf [4096];
  char dst [4096];
  char src [4096];
  char local_3028 [4096];
  char local_2028 [4096];
  char local_1028 [4104];
  long lVar6;
  
  pcVar9 = local_3028;
  pcVar12 = local_3028;
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[2];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
LAB_00136b5f:
    if (0xfff < iVar4) goto LAB_00136bcf;
    unaff_EBP = iVar4 + 1;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      goto LAB_00136b5f;
    }
    error("LispStringLength: Not a character array.\n");
  }
  uVar2 = args[1];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    unaff_EBP = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    unaff_EBP = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  }
  else {
    error("LispStringLength: Not a character array.\n");
  }
  if (unaff_EBP < 0x1000) {
    uVar2 = *args;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    iVar5 = 0x1000;
    if (iVar4 < 0x1000) {
      iVar5 = iVar4;
    }
    lVar6 = (long)iVar5;
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      pcVar10 = local_3028;
      if (iVar4 != 0) {
        lVar6 = lVar6 + (ulong)(lVar6 == 0);
        pDVar8 = Lisp_world +
                 (ulong)Lisp_world[(ulong)uVar2 + 2] +
                 (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
        do {
          *pcVar9 = *(undefined1 *)((ulong)pDVar8 ^ 2);
          pcVar9 = pcVar9 + 1;
          pDVar8 = pDVar8 + 1;
          lVar6 = lVar6 + -1;
          pcVar10 = pcVar9;
        } while (lVar6 != 0);
      }
      *pcVar10 = 0;
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      if (iVar4 != 0) {
        uVar3 = *(uint *)(Lisp_world + uVar2);
        uVar1 = Lisp_world[(ulong)uVar2 + 2];
        lVar11 = 0;
        do {
          local_3028[lVar11] =
               *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                        3);
          lVar11 = lVar11 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
      }
      local_3028[lVar6] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar4 = unixpathname(local_3028,local_1028,0,0);
    if (iVar4 == 0) {
      return 0;
    }
    uVar2 = args[1];
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
    iVar5 = 0x1000;
    if (iVar4 < 0x1000) {
      iVar5 = iVar4;
    }
    lVar6 = (long)iVar5;
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
      pcVar9 = local_3028;
      if (iVar4 != 0) {
        lVar6 = lVar6 + (ulong)(lVar6 == 0);
        pDVar8 = Lisp_world +
                 (ulong)Lisp_world[(ulong)uVar2 + 2] +
                 (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
        do {
          *pcVar12 = *(undefined1 *)((ulong)pDVar8 ^ 2);
          pcVar12 = pcVar12 + 1;
          pDVar8 = pDVar8 + 1;
          lVar6 = lVar6 + -1;
          pcVar9 = pcVar12;
        } while (lVar6 != 0);
      }
      *pcVar9 = 0;
    }
    else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      if (iVar4 != 0) {
        uVar3 = *(uint *)(Lisp_world + uVar2);
        uVar1 = Lisp_world[(ulong)uVar2 + 2];
        lVar11 = 0;
        do {
          local_3028[lVar11] =
               *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^
                        3);
          lVar11 = lVar11 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar11);
      }
      local_3028[lVar6] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    iVar4 = unixpathname(local_3028,local_2028,0,0);
    if (iVar4 != 0) {
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      do {
        *piVar7 = 0;
        iVar4 = rename(local_1028,local_2028);
        if (iVar4 != -1) {
          alarm(0);
          return 0x4c;
        }
      } while (*piVar7 == 4);
      alarm(0);
      *Lisp_errno = *piVar7;
      return 0;
    }
    return 0;
  }
LAB_00136bcf:
  *Lisp_errno = 200;
  return 0;
}

Assistant:

LispPTR UFS_renamefile(LispPTR *args)
{
  char fbuf[MAXPATHLEN], src[MAXPATHLEN], dst[MAXPATHLEN];
  int rval, len;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[2]));

  LispStringLength(args[0], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], len, rval);
  len += 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, src, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, src, 0, 0) == 0) return (NIL);
#endif /* DOS */
  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  if (unixpathname(fbuf, dst, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(fbuf, dst, 0, 0) == 0) return (NIL);
#endif /* DOS */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  return (ATOM_T);
}